

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFastMap.c
# Opt level: O2

int Ivy_FastMapCutCost(Ivy_Man_t *pAig,Vec_Ptr_t *vFront)

{
  int *piVar1;
  int i;
  int iVar2;
  
  iVar2 = 0;
  for (i = 0; i < vFront->nSize; i = i + 1) {
    piVar1 = (int *)Vec_PtrEntry(vFront,i);
    iVar2 = iVar2 + (uint)(*(int *)(*(long *)((long)pAig->pData + 0x10) + 4 +
                                   (long)*(int *)((long)pAig->pData + 8) * (long)*piVar1) == 0);
  }
  return iVar2;
}

Assistant:

int Ivy_FastMapCutCost( Ivy_Man_t * pAig, Vec_Ptr_t * vFront )
{
    Ivy_Supp_t * pSuppF;
    Ivy_Obj_t * pFanin;
    int i, Counter = 0;
    Vec_PtrForEachEntry( Ivy_Obj_t *, vFront, pFanin, i )
    {
        pSuppF = Ivy_ObjSupp( pAig, pFanin );
        if ( pSuppF->nRefs == 0 )
            Counter++;
    }
    return Counter;
}